

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_ConvertToGrayScale(ConvertToGrayScaleForm2 ConvertToGrayScale)

{
  uint8_t value;
  bool bVar1;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Image local_40;
  
  Unit_Test::intensityArray(&local_58,2);
  value = *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&local_40,value,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_80,local_40._width,local_40._height,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (&local_80,
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  (*ConvertToGrayScale)(&local_40,&local_80);
  bVar1 = Unit_Test::verifyImage
                    (&local_80,
                     *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form2_ConvertToGrayScale(ConvertToGrayScaleForm2 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensity[1] );

        ConvertToGrayScale( input, output );

        return verifyImage( output, intensity[0] );
    }